

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_4402ef::ConversionExpr::printLeft(ConversionExpr *this,OutputStream *S)

{
  Node *pNVar1;
  char *pcVar2;
  size_t sVar3;
  
  OutputStream::grow(S,1);
  S->Buffer[S->CurrentPosition] = '(';
  S->CurrentPosition = S->CurrentPosition + 1;
  pNVar1 = this->Type;
  (*pNVar1->_vptr_Node[4])(pNVar1,S);
  if (pNVar1->RHSComponentCache != No) {
    (*pNVar1->_vptr_Node[5])(pNVar1,S);
  }
  OutputStream::grow(S,2);
  pcVar2 = S->Buffer;
  sVar3 = S->CurrentPosition;
  (pcVar2 + sVar3)[0] = ')';
  (pcVar2 + sVar3)[1] = '(';
  S->CurrentPosition = S->CurrentPosition + 2;
  NodeArray::printWithComma(&this->Expressions,S);
  OutputStream::grow(S,1);
  S->Buffer[S->CurrentPosition] = ')';
  S->CurrentPosition = S->CurrentPosition + 1;
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    S += "(";
    Type->print(S);
    S += ")(";
    Expressions.printWithComma(S);
    S += ")";
  }